

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool cs::compiler_type::find_id_ref(iterator it,string *id)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  token_base **pptVar4;
  var_id *this;
  iterator in_RSI;
  tree_type<cs::token_base_*> *tree;
  iterator __end3;
  iterator __begin3;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range3;
  token_base *token;
  undefined4 in_stack_ffffffffffffff68;
  _Self *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  iterator *in_stack_ffffffffffffffb0;
  iterator *in_stack_ffffffffffffffb8;
  token_array *this_00;
  iterator local_10;
  __type local_1;
  
  bVar1 = tree_type<cs::token_base_*>::iterator::usable(&local_10);
  if (bVar1) {
    pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffffb0);
    this_00 = (token_array *)*pptVar4;
    if (this_00 == (token_array *)0x0) {
      local_1 = false;
    }
    else {
      iVar3 = (*(this_00->super_token_base)._vptr_token_base[2])();
      if (iVar3 == 4) {
        this = token_id::get_id((token_id *)this_00);
        var_id::get_id_abi_cxx11_(this);
        local_1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      else if (iVar3 == 0xc) {
        pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffffb0);
        token_expr::get_tree((token_expr *)*pptVar4);
        tree_type<cs::token_base_*>::root
                  ((tree_type<cs::token_base_*> *)CONCAT44(iVar3,in_stack_ffffffffffffff68));
        local_1 = find_id_ref(in_RSI,(string *)this_00);
      }
      else if (iVar3 == 0xe) {
        token_array::get_array(this_00);
        std::
        deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
        begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
               *)CONCAT44(iVar3,in_stack_ffffffffffffff68));
        std::
        deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
        end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             *)CONCAT44(iVar3,in_stack_ffffffffffffff68));
        while (bVar1 = std::operator!=(in_stack_ffffffffffffff70,
                                       (_Self *)CONCAT44(iVar3,in_stack_ffffffffffffff68)), bVar1) {
          std::
          _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
          ::operator*((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                       *)&stack0xffffffffffffffb0);
          tree_type<cs::token_base_*>::root
                    ((tree_type<cs::token_base_*> *)CONCAT44(iVar3,in_stack_ffffffffffffff68));
          bVar1 = find_id_ref(in_RSI,(string *)this_00);
          if (bVar1) {
            return true;
          }
          std::
          _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
          ::operator++(in_stack_ffffffffffffff70);
        }
        local_1 = false;
      }
      else {
        tree_type<cs::token_base_*>::iterator::left(in_stack_ffffffffffffffb8);
        bVar1 = find_id_ref(in_RSI,(string *)this_00);
        bVar2 = true;
        if (!bVar1) {
          tree_type<cs::token_base_*>::iterator::right(in_stack_ffffffffffffffb8);
          bVar2 = find_id_ref(in_RSI,(string *)this_00);
        }
        if (bVar2 == false) {
          local_1 = false;
        }
        else {
          local_1 = true;
        }
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool compiler_type::find_id_ref(tree_type<token_base *>::iterator it, const std::string &id)
	{
		if (!it.usable())
			return false;
		token_base *token = it.data();
		if (token == nullptr)
			return false;
		switch (token->get_type()) {
		default:
			break;
		case token_types::id:
			return static_cast<token_id *>(token)->get_id().get_id() == id;
		case token_types::expr:
			return find_id_ref(static_cast<token_expr *>(it.data())->get_tree().root(), id);
		case token_types::array: {
			for (auto &tree: static_cast<token_array *>(token)->get_array()) {
				if (find_id_ref(tree.root(), id))
					return true;
			}
			return false;
		}
		}
		if (find_id_ref(it.left(), id) || find_id_ref(it.right(), id))
			return true;
		else
			return false;
	}